

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::Encode(GroupAssignmentRecord *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,this->m_ui32GrpBtField);
  (*(this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_Entity,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16DstCommsDvcID);
  KDataStream::Write(stream,this->m_ui8DstLineID);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding1);
  KDataStream::Write(stream,this->m_ui8Padding2);
  return;
}

Assistant:

void GroupAssignmentRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32GrpBtField
           << KDIS_STREAM m_Entity
           << m_ui16DstCommsDvcID
           << m_ui8DstLineID
           << m_ui16Padding1
           << m_ui8Padding2;
}